

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

void __thiscall
wasm::SmallVector<std::pair<wasm::WasmException,_wasm::Name>,_4UL>::pop_back
          (SmallVector<std::pair<wasm::WasmException,_wasm::Name>,_4UL> *this)

{
  bool bVar1;
  SmallVector<std::pair<wasm::WasmException,_wasm::Name>,_4UL> *this_local;
  
  bVar1 = std::
          vector<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
          ::empty(&this->flexible);
  if (bVar1) {
    if (this->usedFixed == 0) {
      __assert_fail("usedFixed > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/support/small_vector.h"
                    ,0x51,
                    "void wasm::SmallVector<std::pair<wasm::WasmException, wasm::Name>, 4>::pop_back() [T = std::pair<wasm::WasmException, wasm::Name>, N = 4]"
                   );
    }
    this->usedFixed = this->usedFixed - 1;
  }
  else {
    std::
    vector<std::pair<wasm::WasmException,_wasm::Name>,_std::allocator<std::pair<wasm::WasmException,_wasm::Name>_>_>
    ::pop_back(&this->flexible);
  }
  return;
}

Assistant:

void pop_back() {
    if (flexible.empty()) {
      assert(usedFixed > 0);
      usedFixed--;
    } else {
      flexible.pop_back();
    }
  }